

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O3

void __thiscall
UnifiedRegex::RegexStacks::RegexStacks(RegexStacks *this,PageAllocator *pageAllocator)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  (this->contStack).super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>.
  super_ContinuousPageStack<1UL>.super_Allocator.outOfMemoryFunc = Js::Throw::OutOfMemory;
  (this->contStack).super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>.
  super_ContinuousPageStack<1UL>.super_Allocator.recoverMemoryFunc =
       JsUtil::ExternalApi::RecoverUnusedMemory;
  (this->contStack).super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>.
  super_ContinuousPageStack<1UL>.pageAllocator = pageAllocator;
  (this->contStack).super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>.
  super_ContinuousPageStack<1UL>.bufferSize = 0;
  (this->contStack).super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>.
  super_ContinuousPageStack<1UL>.nextTop = 0;
  if (pageAllocator != (PageAllocator *)0x0) {
    (this->assertionStack).
    super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>.
    super_ContinuousPageStack<1UL>.super_Allocator.outOfMemoryFunc = Js::Throw::OutOfMemory;
    (this->assertionStack).
    super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>.
    super_ContinuousPageStack<1UL>.super_Allocator.recoverMemoryFunc =
         JsUtil::ExternalApi::RecoverUnusedMemory;
    (this->assertionStack).
    super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>.
    super_ContinuousPageStack<1UL>.pageAllocator = pageAllocator;
    (this->assertionStack).
    super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>.
    super_ContinuousPageStack<1UL>.bufferSize = 0;
    (this->assertionStack).
    super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>.
    super_ContinuousPageStack<1UL>.nextTop = 0;
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                     ,0xba,"(pageAllocator)","pageAllocator");
  if (bVar2) {
    *puVar3 = 0;
    (this->assertionStack).
    super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>.
    super_ContinuousPageStack<1UL>.super_Allocator.outOfMemoryFunc = Js::Throw::OutOfMemory;
    (this->assertionStack).
    super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>.
    super_ContinuousPageStack<1UL>.super_Allocator.recoverMemoryFunc =
         JsUtil::ExternalApi::RecoverUnusedMemory;
    (this->assertionStack).
    super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>.
    super_ContinuousPageStack<1UL>.pageAllocator = (PageAllocator *)0x0;
    (this->assertionStack).
    super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>.
    super_ContinuousPageStack<1UL>.bufferSize = 0;
    (this->assertionStack).
    super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>.
    super_ContinuousPageStack<1UL>.nextTop = 0;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0xba,"(pageAllocator)","pageAllocator");
    if (bVar2) {
      *puVar3 = 0;
      return;
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

RegexStacks(PageAllocator * pageAllocator) :
            contStack(pageAllocator, Js::Throw::OutOfMemory),
            assertionStack(pageAllocator, Js::Throw::OutOfMemory) {}